

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_string(char *text,int text_len,int posX,int posY,int fontSize,rf_color color)

{
  rf_font font;
  rf_vec2 position_00;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int spacing;
  int defaultFontSize;
  rf_vec2 position;
  int local_28;
  int fontSize_local;
  int posY_local;
  int posX_local;
  int text_len_local;
  char *text_local;
  rf_color color_local;
  
  rf_get_default_font();
  if ((position.y != 0.0) && (text_len != 0)) {
    local_28 = fontSize;
    if (fontSize < 10) {
      local_28 = 10;
    }
    rf_get_default_font();
    position_00.y = (float)posY;
    position_00.x = (float)posX;
    font.texture._4_8_ = uStack_a0;
    font._0_8_ = local_a8;
    font.texture._12_8_ = local_98;
    font._24_8_ = uStack_90;
    font.glyphs = (rf_glyph_info *)local_88;
    font.glyphs_count = uStack_80;
    font._48_8_ = local_78;
    rf_draw_string_ex(font,text,text_len,position_00,(float)local_28,(float)(local_28 / 10),color);
  }
  return;
}

Assistant:

RF_API void rf_draw_string(const char* text, int text_len, int posX, int posY, int fontSize, rf_color color)
{
    // Check if default font has been loaded
    if (rf_get_default_font().texture.id == 0 || text_len == 0) return;

    rf_vec2 position = { (float)posX, (float)posY };

    int defaultFontSize = 10;   // Default Font chars height in pixel
    if (fontSize < defaultFontSize) fontSize = defaultFontSize;
    int spacing = fontSize/defaultFontSize;

    rf_draw_string_ex(rf_get_default_font(), text, text_len, position, (float)fontSize, (float)spacing, color);
}